

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

void png_read_info(png_structrp png_ptr,png_inforp info_ptr)

{
  png_uint_32 chunk_name;
  uint uVar1;
  png_uint_32 length;
  int keep;
  char *error_message;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_structrp)0x0) {
    png_read_sig(png_ptr,info_ptr);
LAB_001208b3:
    do {
      length = png_read_chunk_header(png_ptr);
      chunk_name = png_ptr->chunk_name;
      if (chunk_name == 0x49444154) {
        uVar1 = png_ptr->mode;
        if ((uVar1 & 1) == 0) {
          error_message = "Missing IHDR before IDAT";
LAB_00120c64:
          png_chunk_error(png_ptr,error_message);
        }
        if (((uVar1 & 2) == 0) && (png_ptr->color_type == '\x03')) {
          error_message = "Missing PLTE before IDAT";
          goto LAB_00120c64;
        }
        if ((uVar1 & 8) != 0) {
          png_chunk_benign_error(png_ptr,"Too many IDATs found");
        }
        *(byte *)&png_ptr->mode = (byte)png_ptr->mode | 4;
      }
      else if ((png_ptr->mode & 4) != 0) {
        png_ptr->mode = png_ptr->mode | 0x2008;
      }
      if (chunk_name == 0x49454e44) {
        png_handle_IEND(png_ptr,info_ptr,length);
        goto LAB_001208b3;
      }
      if (chunk_name == 0x49484452) {
        png_handle_IHDR(png_ptr,info_ptr,length);
        goto LAB_001208b3;
      }
      keep = png_chunk_unknown_handling(png_ptr,chunk_name);
      if (keep == 0) {
        if (chunk_name == 0x504c5445) {
          png_handle_PLTE(png_ptr,info_ptr,length);
          goto LAB_001208b3;
        }
        if (chunk_name == 0x49444154) goto LAB_00120c45;
        if ((int)chunk_name < 0x70485973) {
          if ((int)chunk_name < 0x68495354) {
            if ((int)chunk_name < 0x65584966) {
              if (chunk_name == 0x624b4744) {
                png_handle_bKGD(png_ptr,info_ptr,length);
                goto LAB_001208b3;
              }
              if (chunk_name == 0x6348524d) {
                png_handle_cHRM(png_ptr,info_ptr,length);
                goto LAB_001208b3;
              }
            }
            else {
              if (chunk_name == 0x65584966) {
                png_handle_eXIf(png_ptr,info_ptr,length);
                goto LAB_001208b3;
              }
              if (chunk_name == 0x67414d41) {
                png_handle_gAMA(png_ptr,info_ptr,length);
                goto LAB_001208b3;
              }
            }
          }
          else if ((int)chunk_name < 0x69545874) {
            if (chunk_name == 0x68495354) {
              png_handle_hIST(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
            if (chunk_name == 0x69434350) {
              png_handle_iCCP(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
          }
          else {
            if (chunk_name == 0x69545874) {
              png_handle_iTXt(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
            if (chunk_name == 0x6f464673) {
              png_handle_oFFs(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
            if (chunk_name == 0x7043414c) {
              png_handle_pCAL(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
          }
        }
        else if ((int)chunk_name < 0x73524742) {
          if ((int)chunk_name < 0x7343414c) {
            if (chunk_name == 0x70485973) {
              png_handle_pHYs(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
            if (chunk_name == 0x73424954) {
              png_handle_sBIT(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
          }
          else {
            if (chunk_name == 0x7343414c) {
              png_handle_sCAL(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
            if (chunk_name == 0x73504c54) {
              png_handle_sPLT(png_ptr,info_ptr,length);
              goto LAB_001208b3;
            }
          }
        }
        else if ((int)chunk_name < 0x74494d45) {
          if (chunk_name == 0x73524742) {
            png_handle_sRGB(png_ptr,info_ptr,length);
            goto LAB_001208b3;
          }
          if (chunk_name == 0x74455874) {
            png_handle_tEXt(png_ptr,info_ptr,length);
            goto LAB_001208b3;
          }
        }
        else {
          if (chunk_name == 0x74494d45) {
            png_handle_tIME(png_ptr,info_ptr,length);
            goto LAB_001208b3;
          }
          if (chunk_name == 0x74524e53) {
            png_handle_tRNS(png_ptr,info_ptr,length);
            goto LAB_001208b3;
          }
          if (chunk_name == 0x7a545874) {
            png_handle_zTXt(png_ptr,info_ptr,length);
            goto LAB_001208b3;
          }
        }
        png_handle_unknown(png_ptr,info_ptr,length,0);
        goto LAB_001208b3;
      }
      png_handle_unknown(png_ptr,info_ptr,length,keep);
      if (chunk_name == 0x504c5445) {
        *(byte *)&png_ptr->mode = (byte)png_ptr->mode | 2;
        goto LAB_001208b3;
      }
    } while (chunk_name != 0x49444154);
    length = 0;
LAB_00120c45:
    png_ptr->idat_size = length;
  }
  return;
}

Assistant:

void PNGAPI
png_read_info(png_structrp png_ptr, png_inforp info_ptr)
{
#ifdef PNG_HANDLE_AS_UNKNOWN_SUPPORTED
   int keep;
#endif

   png_debug(1, "in png_read_info");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   /* Read and check the PNG file signature. */
   png_read_sig(png_ptr, info_ptr);

   for (;;)
   {
      png_uint_32 length = png_read_chunk_header(png_ptr);
      png_uint_32 chunk_name = png_ptr->chunk_name;

      /* IDAT logic needs to happen here to simplify getting the two flags
       * right.
       */
      if (chunk_name == png_IDAT)
      {
         if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
            png_chunk_error(png_ptr, "Missing IHDR before IDAT");

         else if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
             (png_ptr->mode & PNG_HAVE_PLTE) == 0)
            png_chunk_error(png_ptr, "Missing PLTE before IDAT");

         else if ((png_ptr->mode & PNG_AFTER_IDAT) != 0)
            png_chunk_benign_error(png_ptr, "Too many IDATs found");

         png_ptr->mode |= PNG_HAVE_IDAT;
      }

      else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      {
         png_ptr->mode |= PNG_HAVE_CHUNK_AFTER_IDAT;
         png_ptr->mode |= PNG_AFTER_IDAT;
      }

      /* This should be a binary subdivision search or a hash for
       * matching the chunk name rather than a linear search.
       */
      if (chunk_name == png_IHDR)
         png_handle_IHDR(png_ptr, info_ptr, length);

      else if (chunk_name == png_IEND)
         png_handle_IEND(png_ptr, info_ptr, length);

#ifdef PNG_HANDLE_AS_UNKNOWN_SUPPORTED
      else if ((keep = png_chunk_unknown_handling(png_ptr, chunk_name)) != 0)
      {
         png_handle_unknown(png_ptr, info_ptr, length, keep);

         if (chunk_name == png_PLTE)
            png_ptr->mode |= PNG_HAVE_PLTE;

         else if (chunk_name == png_IDAT)
         {
            png_ptr->idat_size = 0; /* It has been consumed */
            break;
         }
      }
#endif
      else if (chunk_name == png_PLTE)
         png_handle_PLTE(png_ptr, info_ptr, length);

      else if (chunk_name == png_IDAT)
      {
         png_ptr->idat_size = length;
         break;
      }

#ifdef PNG_READ_bKGD_SUPPORTED
      else if (chunk_name == png_bKGD)
         png_handle_bKGD(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_cHRM_SUPPORTED
      else if (chunk_name == png_cHRM)
         png_handle_cHRM(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_eXIf_SUPPORTED
      else if (chunk_name == png_eXIf)
         png_handle_eXIf(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_gAMA_SUPPORTED
      else if (chunk_name == png_gAMA)
         png_handle_gAMA(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_hIST_SUPPORTED
      else if (chunk_name == png_hIST)
         png_handle_hIST(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_oFFs_SUPPORTED
      else if (chunk_name == png_oFFs)
         png_handle_oFFs(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_pCAL_SUPPORTED
      else if (chunk_name == png_pCAL)
         png_handle_pCAL(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_sCAL_SUPPORTED
      else if (chunk_name == png_sCAL)
         png_handle_sCAL(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_pHYs_SUPPORTED
      else if (chunk_name == png_pHYs)
         png_handle_pHYs(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_sBIT_SUPPORTED
      else if (chunk_name == png_sBIT)
         png_handle_sBIT(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_sRGB_SUPPORTED
      else if (chunk_name == png_sRGB)
         png_handle_sRGB(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_iCCP_SUPPORTED
      else if (chunk_name == png_iCCP)
         png_handle_iCCP(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_sPLT_SUPPORTED
      else if (chunk_name == png_sPLT)
         png_handle_sPLT(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_tEXt_SUPPORTED
      else if (chunk_name == png_tEXt)
         png_handle_tEXt(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_tIME_SUPPORTED
      else if (chunk_name == png_tIME)
         png_handle_tIME(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_tRNS_SUPPORTED
      else if (chunk_name == png_tRNS)
         png_handle_tRNS(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_zTXt_SUPPORTED
      else if (chunk_name == png_zTXt)
         png_handle_zTXt(png_ptr, info_ptr, length);
#endif

#ifdef PNG_READ_iTXt_SUPPORTED
      else if (chunk_name == png_iTXt)
         png_handle_iTXt(png_ptr, info_ptr, length);
#endif

      else
         png_handle_unknown(png_ptr, info_ptr, length,
             PNG_HANDLE_CHUNK_AS_DEFAULT);
   }
}